

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+
          (TPZSFMatrix<long_double> *__return_storage_ptr__,TPZSFMatrix<long_double> *this,
          TPZMatrix<long_double> *A)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  longdouble *plVar8;
  longdouble *plVar9;
  long lVar10;
  int64_t c;
  long lVar11;
  int64_t r;
  long lVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  iVar7 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar6) != CONCAT44(extraout_var_00,iVar7)) {
    TPZMatrix<long_double>::Error
              ("TPZSFMatrix<TVar> TPZSFMatrix<long double>::operator+(const TPZMatrix<TVar> &) const [TVar = long double]"
               ,"Operator+ <matrixs with incoompatible dimensions");
  }
  TPZSFMatrix(__return_storage_ptr__,this);
  plVar8 = __return_storage_ptr__->fElem;
  lVar10 = 1;
  lVar11 = 0;
  while( true ) {
    iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar6) <= lVar11) break;
    lVar12 = 0;
    plVar9 = plVar8;
    lVar13 = in_ST0;
    lVar1 = in_ST1;
    lVar2 = in_ST2;
    lVar3 = in_ST3;
    lVar4 = in_ST4;
    lVar5 = in_ST5;
    in_ST5 = in_ST6;
    do {
      in_ST4 = lVar5;
      in_ST3 = lVar4;
      in_ST2 = lVar3;
      in_ST1 = lVar2;
      in_ST0 = lVar1;
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar12,lVar11);
      plVar8 = plVar9 + 1;
      *plVar9 = *plVar9 + lVar13;
      lVar12 = lVar12 + 1;
      plVar9 = plVar8;
      lVar13 = in_ST0;
      lVar1 = in_ST1;
      lVar2 = in_ST2;
      lVar3 = in_ST3;
      lVar4 = in_ST4;
      lVar5 = in_ST5;
    } while (lVar10 != lVar12);
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 1;
    in_ST6 = in_ST5;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSFMatrix<TVar>
TPZSFMatrix<TVar> ::operator+(const TPZMatrix<TVar>  &A ) const
{
	if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Operator+ <matrixs with incoompatible dimensions" );
	
	auto  res(*this);
	TVar *pr = res.fElem;
	for ( int64_t c = 0; c < this->Dim(); c++ )
		for ( int64_t r = 0; r <= c; r++ )
			*pr++ += A.Get( r, c );
	
	return res;
}